

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O2

void * GENERAL_NAME_get0_value(GENERAL_NAME *a,int *ptype)

{
  uint uVar1;
  
  uVar1 = a->type;
  if (ptype != (int *)0x0) {
    *ptype = uVar1;
  }
  if (uVar1 < 9) {
    return (a->d).ptr;
  }
  return (void *)0x0;
}

Assistant:

void *GENERAL_NAME_get0_value(const GENERAL_NAME *a, int *out_type) {
  if (out_type) {
    *out_type = a->type;
  }
  switch (a->type) {
    case GEN_X400:
      return a->d.x400Address;

    case GEN_EDIPARTY:
      return a->d.ediPartyName;

    case GEN_OTHERNAME:
      return a->d.otherName;

    case GEN_EMAIL:
    case GEN_DNS:
    case GEN_URI:
      return a->d.ia5;

    case GEN_DIRNAME:
      return a->d.dirn;

    case GEN_IPADD:
      return a->d.ip;

    case GEN_RID:
      return a->d.rid;

    default:
      return NULL;
  }
}